

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QTextDocument_*,_8>::qt_metatype_id(void)

{
  QByteArray *this;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  int id;
  QByteArray typeName;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_24;
  QByteArray *pQVar1;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  local_24 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x79e532);
  if (local_24 == 0) {
    this = (QByteArray *)QMetaObject::className();
    pQVar1 = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x79e589);
    strlen((char *)this);
    QByteArray::reserve(pQVar1,asize);
    pQVar1 = QByteArray::append(this,(char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                      in_stack_ffffffffffffffc8));
    QByteArray::append((char)pQVar1);
    local_24 = qRegisterNormalizedMetaType<QTextDocument*>((QByteArray *)0x79e5ca);
    QBasicAtomicInteger<int>::storeRelease((QBasicAtomicInteger<int> *)this,local_24);
    QByteArray::~QByteArray((QByteArray *)0x79e5f0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 1);
        typeName.append(cName).append('*');
        const int newId = qRegisterNormalizedMetaType<T *>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }